

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test<float>(char *name)

{
  bool bVar1;
  int iVar2;
  double __i;
  undefined1 auVar3 [16];
  double mean_error;
  double local_70;
  double local_68;
  double error;
  complex<double> exact;
  complex<double> calculated;
  size_t j;
  size_t i;
  size_t num_comparisons;
  double error_sum;
  char *name_local;
  
  if ((test<float>(char_const*)::dft == '\0') &&
     (iVar2 = __cxa_guard_acquire(&test<float>(char_const*)::dft), iVar2 != 0)) {
    SlidingDFT<float,_64UL>::SlidingDFT(&test<float>::dft);
    __cxa_guard_release(&test<float>(char_const*)::dft);
  }
  num_comparisons = 0;
  i = 0;
  for (j = 0; j < 0x79; j = j + 1) {
    SlidingDFT<float,_64UL>::update(&test<float>::dft,(float)test1_time_domain[j]);
    bVar1 = SlidingDFT<float,_64UL>::is_data_valid(&test<float>::dft);
    if (bVar1) {
      for (calculated._M_value._8_8_ = 0; (ulong)calculated._M_value._8_8_ < 0x40;
          calculated._M_value._8_8_ = calculated._M_value._8_8_ + 1) {
        std::complex<double>::complex
                  ((complex<double> *)(exact._M_value + 8),
                   test<float>::dft.dft + calculated._M_value._8_8_);
        __i = test1_dft_imag[j - 0x3f][calculated._M_value._8_8_];
        std::complex<double>::complex
                  ((complex<double> *)&error,test1_dft_real[j - 0x3f][calculated._M_value._8_8_],__i
                  );
        std::operator-((complex<double> *)(exact._M_value + 8),(complex<double> *)&error);
        local_70 = __i;
        local_68 = std::abs<double>((complex<double> *)&mean_error);
        num_comparisons = (size_t)(local_68 + (double)num_comparisons);
        i = i + 1;
      }
    }
  }
  auVar3._8_4_ = (int)(i >> 0x20);
  auVar3._0_8_ = i;
  auVar3._12_4_ = 0x45300000;
  printf("%s: compared %zu complex numbers with an average error of %e\n",
         (double)num_comparisons /
         ((auVar3._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0)),name,i);
  return;
}

Assistant:

void test(const char *name)
{
	static SlidingDFT<T, test1_FFT_LENGTH> dft;
	double error_sum = 0;
	size_t num_comparisons = 0;

	for (size_t i = 0; i < test1_TIME_LENGTH; i++) {
		dft.update((T)test1_time_domain[i]);
		if (dft.is_data_valid()) {
			for (size_t j = 0; j < test1_FFT_LENGTH; j++) {
				complex<double> calculated = dft.dft[j];
				complex<double> exact(test1_dft_real[i - test1_FFT_LENGTH + 1][j], test1_dft_imag[i - test1_FFT_LENGTH + 1][j]);
				double error = abs(calculated - exact);
				/*printf("[%2i,%2i] Calculated (%10.3e,%10.3e); expected (%10.3e,%10.3e), error=%11.6e\n", i, j,
					   calculated.real(), calculated.imag(),
					   exact.real(), exact.imag(),
					   error);*/
				error_sum += error;
				num_comparisons++;
			}
		}
	}
	double mean_error = error_sum / num_comparisons;
	printf("%s: compared %zu complex numbers with an average error of %e\n", name, num_comparisons, mean_error);
}